

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::io::anon_unknown_0::PrinterTest_AnnotateIndentNewline_Test::TestBody
          (PrinterTest_AnnotateIndentNewline_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ZeroCopyOutputStream *output;
  Matcher<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record> *matchers;
  char *pcVar2;
  string_view text;
  initializer_list<int> __l;
  string_view begin_varname;
  string_view text_00;
  string_view end_varname;
  AssertionResult gtest_ar_1;
  FakeDescriptor descriptor;
  FakeAnnotationCollector_conflict collector;
  Printer printer;
  int end;
  char *file_path;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> semantic;
  int in_stack_fffffffffffffe14;
  allocator_type local_1e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e0;
  undefined4 local_1d8;
  FakeDescriptor local_1d0;
  MatcherBase<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>
  local_198;
  AnnotationCollector local_180;
  ZeroCopyOutputStream *local_178;
  long lStack_170;
  undefined8 local_168;
  MatcherBase<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>
  local_160;
  undefined1 local_148 [8];
  VTable *local_140;
  Buffer local_138;
  size_t local_f0;
  size_t local_e0;
  pointer local_c8;
  pointer local_b8;
  vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  local_b0;
  vector<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  local_98;
  TypeErasedState local_78;
  ManagerType *local_68;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  local_180._vptr_AnnotationCollector = (_func_int **)&PTR__FakeAnnotationCollector_01947a48;
  local_178 = (ZeroCopyOutputStream *)0x0;
  lStack_170 = 0;
  local_168 = 0;
  output = PrinterTest::output(&this->super_PrinterTest);
  Printer::Printer((Printer *)local_148,output,'$',&local_180);
  local_e0 = local_e0 + local_f0;
  pcVar2 = anon_var_dwarf_a12c75 + 5;
  semantic = (_Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>)
             ((long)anon_var_dwarf_a12c75 + 5);
  file_path = "B";
  text._M_str = "$A$$N$$B$C\n";
  text._M_len = 0xb;
  Printer::Print<char[2],char[1],char[2],char[3],char[2],char[1]>
            ((Printer *)local_148,text,(char (*) [2])0x11d2942,
             (char (*) [1])(anon_var_dwarf_a12c75 + 5),(char (*) [2])0x147a685,(char (*) [3])"\nz",
             (char (*) [2])0x147c346,(char (*) [1])(anon_var_dwarf_a12c75 + 5));
  paVar1 = &local_1d0.fake_file.filename.field_2;
  local_1d0.fake_file.filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"path","");
  local_198.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_4_ = 0;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_198;
  std::vector<int,_std::allocator<int>_>::vector(&local_1d0.path,__l,local_1e8);
  end = 0;
  begin_varname._M_str = "A";
  begin_varname._M_len = 1;
  end_varname._M_str = "B";
  end_varname._M_len = 1;
  Printer::Annotate<google::protobuf::io::(anonymous_namespace)::FakeDescriptor>
            ((Printer *)local_148,begin_varname,end_varname,&local_1d0,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  Printer::Outdent((Printer *)local_148);
  text_00._M_str = "\n";
  text_00._M_len = 1;
  Printer::Print<>((Printer *)local_148,text_00);
  if (local_1d0.path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1d0.path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d0.path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d0.path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0.fake_file.filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d0.fake_file.filename._M_dataplus._M_p,
                    local_1d0.fake_file.filename.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  ::~raw_hash_set(&local_58);
  (*local_68)(dispose,&local_78,&local_78);
  std::
  vector<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  ::~vector(&local_98);
  std::
  vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  ::~vector(&local_b0);
  if (local_c8 != (pointer)0x0) {
    operator_delete(local_c8,(long)local_b8 - (long)local_c8);
  }
  if (local_138.ptr != (void *)0x0) {
    (*(*(_func_int ***)local_148)[3])();
  }
  if ((this->super_PrinterTest).stream_.
      super__Optional_base<google::protobuf::io::StringOutputStream,_false,_false>._M_payload.
      super__Optional_payload<google::protobuf::io::StringOutputStream,_true,_false,_false>.
      super__Optional_payload_base<google::protobuf::io::StringOutputStream>._M_engaged == true) {
    (this->super_PrinterTest).stream_.
    super__Optional_base<google::protobuf::io::StringOutputStream,_false,_false>._M_payload.
    super__Optional_payload<google::protobuf::io::StringOutputStream,_true,_false,_false>.
    super__Optional_payload_base<google::protobuf::io::StringOutputStream>._M_engaged = false;
  }
  local_1d0.fake_file.filename._M_string_length =
       (size_type)(this->super_PrinterTest).out_._M_dataplus._M_p;
  local_1d0.fake_file.filename._M_dataplus._M_p =
       (pointer)(this->super_PrinterTest).out_._M_string_length;
  testing::internal::CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,char[8]>
            ((internal *)local_148,"written()","\"\\nz  C\\n\\n\"",
             (basic_string_view<char,_std::char_traits<char>_> *)&local_1d0,
             (char (*) [8])"\nz  C\n\n");
  if (local_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1d0);
    if (local_140 != (VTable *)0x0) {
      pcVar2 = ((_Alloc_hider *)&local_140->match_and_explain)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer_unittest.cc"
               ,0x160,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_198,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_198);
    if ((long *)local_1d0.fake_file.filename._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1d0.fake_file.filename._M_dataplus._M_p + 8))();
    }
  }
  if (local_140 != (VTable *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
  }
  local_1d8 = 0;
  io::(anonymous_namespace)::
  Annotation<int,int,char_const*,testing::internal::ElementsAreMatcher<std::tuple<int>>,std::optional<google::protobuf::io::AnnotationCollector::Semantic>>
            (in_stack_fffffffffffffe14,end,file_path,
             printer.annotation_lookups_.
             super__Vector_base<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
             ._M_impl.super__Vector_impl_data._M_start._0_4_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)semantic);
  testing::
  ElementsAre<testing::Matcher<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>>
            ((ElementsAreMatcher<std::tuple<testing::Matcher<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>_>_>
              *)&local_160,(testing *)&local_198,matchers);
  local_140 = local_160.vtable_;
  local_138.ptr = local_160.buffer_.ptr;
  if ((local_160.vtable_ != (VTable *)0x0) &&
     ((local_160.vtable_)->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
    LOCK();
    ((local_160.buffer_.shared)->ref).super___atomic_base<int>._M_i =
         ((local_160.buffer_.shared)->ref).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_148 = (undefined1  [8])&PTR__MatcherBase_01947a98;
  local_1d0.fake_file.filename._M_string_length = (size_type)local_160.vtable_;
  local_1d0.fake_file.filename.field_2._M_allocated_capacity = (size_type)local_160.buffer_;
  if ((local_160.vtable_ != (VTable *)0x0) &&
     ((local_160.vtable_)->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
    LOCK();
    ((local_160.buffer_.shared)->ref).super___atomic_base<int>._M_i =
         ((local_160.buffer_.shared)->ref).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_1d0.fake_file.filename._M_dataplus._M_p = (pointer)&PTR__MatcherBase_01947a98;
  testing::internal::
  MatcherBase<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>::
  ~MatcherBase((MatcherBase<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>
                *)local_148);
  local_140 = (VTable *)((lStack_170 - (long)local_178 >> 4) * -0x3333333333333333);
  local_148 = (undefined1  [8])local_178;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<testing::Matcher<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>>>>
  ::operator()(local_1e8,(char *)&local_1d0,
               (Span<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>
                *)local_148);
  testing::internal::
  MatcherBase<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>::
  ~MatcherBase((MatcherBase<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>
                *)&local_1d0);
  testing::internal::
  MatcherBase<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>::
  ~MatcherBase(&local_160);
  testing::internal::
  MatcherBase<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>::
  ~MatcherBase(&local_198);
  if (local_1e8[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_148);
    if (local_1e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = (local_1e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer_unittest.cc"
               ,0x163,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d0,(Message *)local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d0);
    if (local_148 != (undefined1  [8])0x0) {
      (*(*(_func_int ***)local_148)[1])();
    }
  }
  if (local_1e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1e0,local_1e0);
  }
  FakeAnnotationCollector::~FakeAnnotationCollector((FakeAnnotationCollector *)&local_180);
  return;
}

Assistant:

TEST_F(PrinterTest, AnnotateIndentNewline) {
  FakeAnnotationCollector collector;
  {
    Printer printer(output(), '$', &collector);
    printer.Indent();

    printer.Print("$A$$N$$B$C\n", "A", "", "N", "\nz", "B", "");
    FakeDescriptor descriptor{{"path"}, {0}};
    printer.Annotate("A", "B", &descriptor);

    printer.Outdent();
    printer.Print("\n");
  }
  EXPECT_EQ(written(), "\nz  C\n\n");

  EXPECT_THAT(collector.Get(),
              ElementsAre(Annotation(0, 4, "path", ElementsAre(0))));
}